

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

int __thiscall llvm::StringRef::compare_numeric(StringRef *this,StringRef RHS)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint unaff_EBX;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  ulong local_38;
  
  uVar6 = RHS.Length;
  pcVar9 = RHS.Data;
  uVar12 = this->Length;
  if (uVar6 <= this->Length) {
    uVar12 = uVar6;
  }
  uVar5 = 0;
  do {
    if (uVar5 == uVar12) {
      uVar8 = 0;
      if (this->Length != uVar6) {
        bVar14 = this->Length < uVar6;
LAB_00dc450e:
        uVar8 = -(uint)bVar14 | 1;
      }
      return uVar8;
    }
    pcVar3 = this->Data;
    bVar1 = pcVar3[uVar5];
    bVar2 = pcVar9[uVar5];
    if ((byte)(bVar2 - 0x30) < 10 && (byte)(bVar1 - 0x30) < 10) {
      uVar7 = uVar5;
      do {
        uVar11 = uVar7;
        uVar7 = uVar12 + 1;
        local_38 = uVar12;
        if (uVar12 == uVar11) goto LAB_00dc44da;
        uVar7 = uVar11 + 1;
        uVar8 = 0;
        if (uVar7 < this->Length) {
          uVar8 = (uint)((byte)(pcVar3[uVar11 + 1] - 0x30U) < 10);
        }
        if (uVar7 < uVar6) {
          bVar13 = (byte)(pcVar9[uVar11 + 1] - 0x30U) < 10;
          uVar10 = (uint)bVar13;
          bVar14 = uVar8 == uVar10;
          uVar8 = (uint)!bVar13 * 5;
          uVar10 = -uVar10 | 1;
        }
        else {
          bVar14 = uVar8 == 0;
          uVar8 = 5;
          uVar10 = 1;
        }
        if (!bVar14) {
          unaff_EBX = uVar10;
          uVar8 = 1;
        }
      } while (uVar8 == 0);
      local_38 = uVar11;
      if (uVar8 != 5) {
        return unaff_EBX;
      }
LAB_00dc44da:
      iVar4 = compareMemory(pcVar3 + uVar5,pcVar9 + uVar5,uVar7 - uVar5);
      uVar5 = local_38;
      if (iVar4 != 0) {
        return iVar4 >> 0x1f | 1;
      }
    }
    else if (bVar1 != bVar2) {
      bVar14 = bVar1 < bVar2;
      goto LAB_00dc450e;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int StringRef::compare_numeric(StringRef RHS) const {
  for (size_t I = 0, E = std::min(Length, RHS.Length); I != E; ++I) {
    // Check for sequences of digits.
    if (isDigit(Data[I]) && isDigit(RHS.Data[I])) {
      // The longer sequence of numbers is considered larger.
      // This doesn't really handle prefixed zeros well.
      size_t J;
      for (J = I + 1; J != E + 1; ++J) {
        bool ld = J < Length && isDigit(Data[J]);
        bool rd = J < RHS.Length && isDigit(RHS.Data[J]);
        if (ld != rd)
          return rd ? -1 : 1;
        if (!rd)
          break;
      }
      // The two number sequences have the same length (J-I), just memcmp them.
      if (int Res = compareMemory(Data + I, RHS.Data + I, J - I))
        return Res < 0 ? -1 : 1;
      // Identical number sequences, continue search after the numbers.
      I = J - 1;
      continue;
    }
    if (Data[I] != RHS.Data[I])
      return (unsigned char)Data[I] < (unsigned char)RHS.Data[I] ? -1 : 1;
  }
  if (Length == RHS.Length)
    return 0;
  return Length < RHS.Length ? -1 : 1;
}